

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasPropertyQuery
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  Var aValue;
  bool bVar1;
  BOOL BVar2;
  PropertyQueryFlags PVar3;
  Attributes attributes;
  HostScriptContext *pHVar4;
  JavascriptFunction *function;
  JavascriptMethod p_Var5;
  RecyclableObject *ptr;
  Recycler *this_01;
  Var local_60;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  Var local_48;
  Var local_40;
  bool local_32;
  ImplicitCallFlags local_31;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar4 = ThreadContext::GetPreviousHostScriptContext(this_00);
  propertyNameNumericValue = pHVar4->scriptContext;
  BVar2 = EnsureInitialized(this,(ScriptContext *)propertyNameNumericValue);
  if (BVar2 == 0) {
    return Property_NotFound;
  }
  aValue = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (aValue == (Var)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
  }
  if (function == (JavascriptFunction *)0x0) {
LAB_00b3f952:
    PVar3 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
    return (uint)(PVar3 == Property_Found);
  }
  this_01 = *(Recycler **)((long)propertyNameNumericValue + 0x1200);
  bVar1 = Memory::Recycler::IsHeapEnumInProgress(this_01);
  if (bVar1) goto LAB_00b3f952;
  local_48 = GetName((CustomExternalWrapperObject *)this_01,
                     (ScriptContext *)propertyNameNumericValue,propertyId,&local_60,
                     &isPropertyNameNumeric);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  local_40 = local_60;
  local_32 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar1 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar1) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var5);
    p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var5)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,local_48,local_40,isPropertyNameNumeric);
    bVar1 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00b3fb01;
    }
    if ((attributes & HasNoSideEffect) == None) {
      local_31 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var5);
      p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var5)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                      this,local_48,local_40,isPropertyNameNumeric);
      this_00->implicitCallFlags = local_31 | ImplicitCall_Accessor;
      goto LAB_00b3fb01;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var5);
    p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var5)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,local_48,local_40,isPropertyNameNumeric);
    bVar1 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar1 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00b3fb01:
  this_00->reentrancySafeOrHandled = local_32;
  BVar2 = JavascriptConversion::ToBoolean(ptr,(ScriptContext *)propertyNameNumericValue);
  return (uint)(BVar2 != 0);
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasPropertyQuery(Js::PropertyId propertyId, _Inout_opt_ Js::PropertyValueInfo* info)
{
    auto fn = [&](RecyclableObject* object)->BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info));
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, info));
}